

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O3

int NULLCMemory::compare(NULLCArray lhs,int lhsOffset,NULLCArray rhs,int rhsOffset,int size)

{
  int iVar1;
  char *error;
  
  if (lhs.ptr == (char *)0x0) {
LAB_0012ceff:
    error = "buffer is empty";
  }
  else {
    if (lhsOffset < 0) {
LAB_0012cf08:
      error = "offset is negative";
      goto LAB_0012cf0f;
    }
    if (size < 0) {
      error = "element count is negative";
      goto LAB_0012cf0f;
    }
    if ((uint)lhsOffset < lhs.len && (uint)size <= lhs.len - lhsOffset) {
      if (rhs.ptr == (char *)0x0) goto LAB_0012ceff;
      if (rhsOffset < 0) goto LAB_0012cf08;
      if ((uint)rhsOffset < rhs.len && (uint)size <= rhs.len - rhsOffset) {
        iVar1 = memcmp(lhs.ptr + (uint)lhsOffset,rhs.ptr + (uint)rhsOffset,(ulong)(uint)size);
        return iVar1;
      }
    }
    error = "buffer overflow";
  }
LAB_0012cf0f:
  nullcThrowError(error);
  return 0;
}

Assistant:

int compare(NULLCArray lhs, int lhsOffset, NULLCArray rhs, int rhsOffset, int size)
	{
		if(!check_access(lhs, lhsOffset, 0, size))
			return 0;

		if(!check_access(rhs, rhsOffset, 0, size))
			return 0;

		return memcmp(lhs.ptr + lhsOffset, rhs.ptr + rhsOffset, size);
	}